

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

void __thiscall
boost::random::
well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<-18>,boost::random::detail::M3<-14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<-24>,boost::random::detail::M3<5>,boost::random::detail::M3<-1>,boost::random::detail::M0,boost::random::detail::no_tempering>
::seed<unsigned_int*>
          (well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<_18>,boost::random::detail::M3<_14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<_24>,boost::random::detail::M3<5>,boost::random::detail::M3<_1>,boost::random::detail::M0,boost::random::detail::no_tempering>
           *this,uint **first,uint *last)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  detail::fill_array_int_impl<32,19ul,unsigned_int*,unsigned_int>(first,last,(uint (*) [19])this);
  *(undefined8 *)(this + 0x50) = 0x13;
  if ((*(uint *)this < 2) && (*(int *)(this + 4) == 0)) {
    uVar3 = 0;
    do {
      if (uVar3 == 0x11) goto LAB_0012280f;
      uVar1 = uVar3 + 1;
      lVar2 = uVar3 * 4;
      uVar3 = uVar1;
    } while (*(int *)(this + lVar2 + 8) == 0);
    if (0x11 < uVar1) {
LAB_0012280f:
      *(undefined4 *)this = 0x80000000;
    }
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        detail::fill_array_int<w>(first, last, state_);
        index_ = state_size;

        // fix up the state if it's all zeros.
        if ((state_[0] & (~static_cast<UIntType>(0) << mask_bits)) == 0) {
            for (std::size_t j = 1; j < state_size; ++j) {
                if (state_[j] != 0)
                    return;
            }

            state_[0] = static_cast<UIntType>(1) << (w - 1);
        }
    }